

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall
tonk::SenderBandwidthControl::OnReceiverFeedback(SenderBandwidthControl *this,BandwidthShape shape)

{
  BandwidthShape BVar1;
  SenderBandwidthControl *this_local;
  BandwidthShape shape_local;
  
  shape_local.FECRate = shape.FECRate;
  this->RecoverySendCost = (int)(1024.0 / shape_local.FECRate);
  if (((this->Params).IgnoreReceiverFeedback & 1U) == 0) {
    shape_local.AppBPS = shape.AppBPS;
    if (shape_local.AppBPS < 1000) {
      shape_local.AppBPS = 1000;
      BVar1 = shape_local;
    }
    else {
      BVar1 = shape;
      if (((this->Params).MaximumBPS < shape_local.AppBPS) &&
         (BVar1 = shape, (this->Params).MaximumBPS != 0)) {
        shape_local.AppBPS = (this->Params).MaximumBPS;
        BVar1 = shape_local;
      }
    }
    shape_local = BVar1;
    this->Shape = shape_local;
  }
  else {
    (this->Shape).AppBPS = (this->Params).MaximumBPS;
  }
  return;
}

Assistant:

void SenderBandwidthControl::OnReceiverFeedback(BandwidthShape shape)
{
    // Update recovery send cost
    RecoverySendCost = static_cast<int>(kReliableRewardTokens / shape.FECRate);

    // Ignore receiver feedback?
    if (Params.IgnoreReceiverFeedback) {
        Shape.AppBPS = Params.MaximumBPS;
        return;
    }

    // Bound shape
    if (shape.AppBPS < protocol::kMinimumBytesPerSecond) {
        shape.AppBPS = protocol::kMinimumBytesPerSecond;
    }
    else if (shape.AppBPS > Params.MaximumBPS && Params.MaximumBPS > 0) {
        shape.AppBPS = Params.MaximumBPS;
    }

    Shape = shape;
}